

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializers.hpp
# Opt level: O0

XMLNodeAdapter * BSDFData::operator>>(XMLNodeAdapter *node,Wavelength *wavelength)

{
  Wavelength *node_00;
  WavelengthUnit *attribute;
  allocator<char> local_91;
  string local_90;
  function<BSDFData::WavelengthUnit_(std::basic_string_view<char,_std::char_traits<char>_>)>
  local_70;
  allocator<char> local_39;
  string local_38;
  Wavelength *local_18;
  Wavelength *wavelength_local;
  XMLNodeAdapter *node_local;
  
  local_18 = wavelength;
  wavelength_local = (Wavelength *)node;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"unit",&local_39);
  attribute = &local_18->unit;
  std::function<BSDFData::WavelengthUnit(std::basic_string_view<char,std::char_traits<char>>)>::
  function<BSDFData::WavelengthUnit(&)(std::basic_string_view<char,std::char_traits<char>>),void>
            ((function<BSDFData::WavelengthUnit(std::basic_string_view<char,std::char_traits<char>>)>
              *)&local_70,WavelengthUnitFromString);
  FileParse::loadAttribute<XMLNodeAdapter,_BSDFData::WavelengthUnit,_0>
            (node,&local_38,attribute,&local_70);
  std::function<BSDFData::WavelengthUnit_(std::basic_string_view<char,_std::char_traits<char>_>)>::
  ~function(&local_70);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  node_00 = wavelength_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"type",&local_91);
  FileParse::loadAttribute<XMLNodeAdapter>((XMLNodeAdapter *)node_00,&local_90,&local_18->type);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  FileParse::operator>>((XMLNodeAdapter *)wavelength_local,&local_18->value);
  return (XMLNodeAdapter *)wavelength_local;
}

Assistant:

const NodeAdapter & operator>>(const NodeAdapter & node, BSDFData::Wavelength & wavelength)
    {
        using FileParse::operator>>;   // operators for basic C++ types are in the FileParse
                                       // namespace

        FileParse::loadAttribute<NodeAdapter, BSDFData::WavelengthUnit>(
          node, "unit", wavelength.unit, WavelengthUnitFromString);
        FileParse::loadAttribute(node, "type", wavelength.type);
        node >> wavelength.value;

        return node;
    }